

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftlzw.c
# Opt level: O0

void ft_lzw_stream_close(FT_Stream stream)

{
  FT_LZWFile zip_00;
  FT_Memory memory_00;
  FT_Memory memory;
  FT_LZWFile zip;
  FT_Stream stream_local;
  
  zip_00 = (FT_LZWFile)(stream->descriptor).pointer;
  memory_00 = stream->memory;
  if (zip_00 != (FT_LZWFile)0x0) {
    ft_lzw_file_done(zip_00);
    ft_mem_free(memory_00,zip_00);
    (stream->descriptor).value = 0;
  }
  return;
}

Assistant:

static void
  ft_lzw_stream_close( FT_Stream  stream )
  {
    FT_LZWFile  zip    = (FT_LZWFile)stream->descriptor.pointer;
    FT_Memory   memory = stream->memory;


    if ( zip )
    {
      /* finalize lzw file descriptor */
      ft_lzw_file_done( zip );

      FT_FREE( zip );

      stream->descriptor.pointer = NULL;
    }
  }